

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O2

void FAudio_INTERNAL_Mix_2in_2out_Scalar
               (uint32_t toMix,uint32_t UNUSED1,uint32_t UNUSED2,float *src,float *dst,
               float *coefficients)

{
  long lVar1;
  
  for (lVar1 = 0; toMix != (uint32_t)lVar1; lVar1 = lVar1 + 1) {
    *(ulong *)(dst + lVar1 * 2) =
         CONCAT44((float)((ulong)*(undefined8 *)(dst + lVar1 * 2) >> 0x20) +
                  src[lVar1 * 2] * coefficients[2] + coefficients[3] * src[lVar1 * 2 + 1],
                  (float)*(undefined8 *)(dst + lVar1 * 2) +
                  src[lVar1 * 2] * *coefficients + coefficients[1] * src[lVar1 * 2 + 1]);
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Mix_2in_2out_Scalar(
	uint32_t toMix,
	uint32_t UNUSED1,
	uint32_t UNUSED2,
	float *restrict src,
	float *restrict dst,
	float *restrict coefficients
) {
	uint32_t i;
	for (i = 0; i < toMix; i += 1, src += 2, dst += 2)
	{
		dst[0] += (
			(src[0] * coefficients[0]) +
			(src[1] * coefficients[1])
		);
		dst[1] += (
			(src[0] * coefficients[2]) +
			(src[1] * coefficients[3])
		);
	}
}